

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SonarAltitudeEstimation.cpp
# Opt level: O0

void * SonarAltitudeEstimationThread(void *pParam)

{
  double dVar1;
  bool bVar2;
  undefined4 uVar3;
  bool bVar4;
  size_type sVar5;
  reference pvVar6;
  reference pdVar7;
  double dVar8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_c8;
  double *local_c0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_b8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_b0;
  iterator it;
  double alpha_mes_robot;
  undefined1 local_90 [8];
  CHRONO chrono;
  undefined1 local_40 [4];
  int i;
  vector<double,_std::allocator<double>_> Vdistances_filtered;
  vector<double,_std::allocator<double>_> Valpha_filtered;
  void *pParam_local;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &Vdistances_filtered.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_40);
  chrono._68_4_ = 0;
  dmin_sonaraltitudeestimation = robheight * 0.5 + d_max_err;
  StartChrono((CHRONO *)local_90);
  do {
    do {
      uSleep(100000);
      if (bExit != 0) goto LAB_0019b9fd;
    } while (bSonarAltitudeEstimation == 0);
    EnterCriticalSection(&SonarAltitudeEstimationCS);
    EnterCriticalSection(&StateVariablesCS);
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)
               &Vdistances_filtered.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)local_40);
    for (chrono._68_4_ = 0; uVar3 = chrono._68_4_,
        sVar5 = std::deque<double,_std::allocator<double>_>::size(&alpha_mes_vector),
        (int)uVar3 < (int)sVar5; chrono._68_4_ = chrono._68_4_ + 1) {
      pvVar6 = std::deque<double,_std::allocator<double>_>::operator[]
                         (&alpha_mes_vector,(long)(int)chrono._68_4_);
      it._M_current = (double *)*pvVar6;
      pvVar6 = std::deque<double,_std::allocator<double>_>::operator[]
                         (&d_mes_vector,(long)(int)chrono._68_4_);
      if (dmin_sonaraltitudeestimation <= *pvVar6) {
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)
                   &Vdistances_filtered.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(value_type_conflict1 *)&it);
        pvVar6 = std::deque<double,_std::allocator<double>_>::operator[]
                           (&d_mes_vector,(long)(int)chrono._68_4_);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)local_40,pvVar6);
      }
    }
    local_b8._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)local_40);
    local_c0 = (double *)
               std::vector<double,_std::allocator<double>_>::end
                         ((vector<double,_std::allocator<double>_> *)local_40);
    local_b0 = std::
               min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                         (local_b8,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                    )local_c0);
    local_c8._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::end
                   ((vector<double,_std::allocator<double>_> *)local_40);
    bVar4 = __gnu_cxx::operator!=(&local_b0,&local_c8);
    bVar2 = false;
    if (bVar4) {
      pdVar7 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_b0);
      bVar2 = *pdVar7 < (double)rangescale;
    }
    if (bVar2) {
      pdVar7 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_b0);
      dVar1 = *pdVar7;
      dVar8 = sin(0.3490658503988659);
      altitude_AGL = dVar1 * dVar8;
    }
    LeaveCriticalSection(&StateVariablesCS);
    LeaveCriticalSection(&SonarAltitudeEstimationCS);
  } while (bExit == 0);
LAB_0019b9fd:
  StopChronoQuick((CHRONO *)local_90);
  if (bExit == 0) {
    bExit = 1;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_40);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &Vdistances_filtered.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE SonarAltitudeEstimationThread(void* pParam)
{
	UNREFERENCED_PARAMETER(pParam);

	vector<double> Valpha_filtered; 
	vector<double> Vdistances_filtered;
	int i = 0;

	CHRONO chrono;

	// Missing error checking...

	dmin_sonaraltitudeestimation = d_max_err+0.5*robheight;

	StartChrono(&chrono);

	for (;;)
	{
		uSleep(1000*100);

		if (bExit) break;
		if (!bSonarAltitudeEstimation) continue;

		EnterCriticalSection(&SonarAltitudeEstimationCS);

		EnterCriticalSection(&StateVariablesCS);

		// Computations are in the robot coordinate system...

		Valpha_filtered.clear();
		Vdistances_filtered.clear();
		for (i = 0; i < (int)alpha_mes_vector.size(); i++)
		{
			double alpha_mes_robot = alpha_mes_vector[i];
			// Filter the distances that are too close or too far away.
			//if ((d_mes_vector[i] >= dmin_sonaraltitudeestimation)&&(d_mes_vector[i] <= rangescale))
			if (d_mes_vector[i] >= dmin_sonaraltitudeestimation)
			{
				Valpha_filtered.push_back(alpha_mes_robot);
				Vdistances_filtered.push_back(d_mes_vector[i]);
			}
		}

		// Temp...

		// Sonar VerticalBeam = 40 deg should be in global...

		std::vector<double>::iterator it = std::min_element(Vdistances_filtered.begin(), Vdistances_filtered.end());
		if ((it != Vdistances_filtered.end())&&((*it) < rangescale)) altitude_AGL = (*it)*sin(0.5*40.0*M_PI/180.0);
		
		LeaveCriticalSection(&StateVariablesCS);

		LeaveCriticalSection(&SonarAltitudeEstimationCS);

		if (bExit) break;
	}

	StopChronoQuick(&chrono);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}